

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethods
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  _List_node_base *p_Var5;
  iterator iVar6;
  iterator DotToken;
  iterator local_40;
  ConversionStream *local_38;
  
  p_Var5 = ScopeStart->_M_node;
  local_38 = this;
  if (ScopeEnd->_M_node != p_Var5) {
    do {
      iVar4 = std::__cxx11::string::compare((char *)&p_Var5[1]._M_prev);
      if (iVar4 == 0) {
        p_Var1 = p_Var5->_M_next;
        p_Var2 = ScopeEnd->_M_node;
        iVar6._M_node = p_Var1;
        local_40._M_node = p_Var5;
        if (p_Var1 != p_Var2) {
          if (*(int *)&p_Var1[1]._M_next == 0x13b) {
            bVar3 = ProcessObjectMethod(local_38,&local_40,ScopeStart,ScopeEnd);
            if (bVar3) {
              iVar6._M_node = local_40._M_node;
            }
          }
          else {
            iVar6._M_node = p_Var1->_M_next;
          }
        }
        if (p_Var1 == p_Var2) {
          return;
        }
      }
      else {
        iVar6._M_node = p_Var5->_M_next;
      }
      p_Var5 = iVar6._M_node;
    } while (iVar6._M_node != ScopeEnd->_M_node);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethods(const TokenListType::iterator& ScopeStart,
                                                                    const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        // Search for .identifier pattern

        if (Token->Literal == ".")
        {
            auto DotToken = Token;
            ++Token;
            if (Token == ScopeEnd)
                break;
            if (Token->Type == TokenType::Identifier)
            {
                if (ProcessObjectMethod(DotToken, ScopeStart, ScopeEnd))
                    Token = DotToken;
            }
            else
            {
                ++Token;
                continue;
            }
        }
        else
            ++Token;
    }
}